

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONNode.cpp
# Opt level: O1

JSONNode __thiscall JSONNode::pop_back(JSONNode *this,json_string *name_t)

{
  size_t *psVar1;
  internalJSONNode *piVar2;
  auto_delete temp;
  JSONNode *ptr;
  out_of_range *this_00;
  string *psVar3;
  json_string *in_RDX;
  
  ptr = internalJSONNode::pop_back((internalJSONNode *)(name_t->_M_dataplus)._M_p,in_RDX);
  if (ptr != (JSONNode *)0x0) {
    piVar2 = ptr->internal;
    psVar1 = &piVar2->refcount;
    *psVar1 = *psVar1 + 1;
    this->internal = piVar2;
    deleteJSONNode(ptr);
    return (JSONNode)(internalJSONNode *)this;
  }
  this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
  psVar3 = jsonSingletonEMPTY_STD_STRING::getValue_abi_cxx11_();
  std::out_of_range::out_of_range(this_00,(string *)psVar3);
  __cxa_throw(this_00,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
}

Assistant:

json_throws(std::out_of_range) {
    JSON_CHECK_INTERNAL();
    JSON_ASSERT(type() == JSON_NODE, json_global(ERROR_NON_ITERATABLE) + JSON_TEXT("pop_back"));
    #ifdef JSON_LIBRARY
	   return internal -> pop_back(name_t);
    #else
	   if (JSONNode * res = internal -> pop_back(name_t)){
		  auto_delete temp(res);
		  return *(temp.mynode);
	   }
	   JSON_FAIL(json_string(JSON_TEXT("pop_back const could not find child by name: ")) + name_t);
	   json_throw(std::out_of_range(json_global(EMPTY_STD_STRING)));
    #endif
}